

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

Slice leveldb::GetLengthPrefixedSlice(char *data)

{
  char cVar1;
  char *in_RAX;
  Slice SVar2;
  uint32_t len;
  undefined8 uStack_8;
  
  cVar1 = *data;
  uStack_8 = in_RAX;
  if (-1 < cVar1) {
    uStack_8 = (char *)CONCAT44((int)cVar1,(int)in_RAX);
    in_RAX = data + 1;
  }
  if (cVar1 < '\0') {
    in_RAX = GetVarint32PtrFallback(data,data + 5,(uint32_t *)((long)&uStack_8 + 4));
  }
  SVar2.size_._0_4_ = uStack_8._4_4_;
  SVar2.data_ = in_RAX;
  SVar2.size_._4_4_ = 0;
  return SVar2;
}

Assistant:

static Slice GetLengthPrefixedSlice(const char* data) {
  uint32_t len;
  const char* p = data;
  p = GetVarint32Ptr(p, p + 5, &len);  // +5: we assume "p" is not corrupted
  return Slice(p, len);
}